

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collection.cpp
# Opt level: O3

bool mpt::add_items(metatype *to,node *head,relation *relation,logger *out)

{
  relation rVar1;
  relation *prVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  collection *pcVar6;
  undefined4 extraout_var;
  char *pcVar7;
  char *pcVar8;
  undefined4 extraout_var_00;
  convertable *pcVar9;
  _func_int **pp_Var10;
  undefined4 extraout_var_01;
  convertable *pcVar11;
  collection *pcVar12;
  relation this;
  reference<mpt::metatype> m;
  object *ptr;
  size_t len;
  char _func [15];
  char *pos;
  identifier id;
  relation local_a8;
  convertable *local_88;
  uint local_80;
  undefined4 uStack_7c;
  undefined7 local_78;
  undefined1 local_71;
  undefined7 uStack_70;
  char *local_68;
  char *local_60;
  undefined8 local_58;
  collection **local_50;
  relation *local_48;
  identifier local_40;
  
  uStack_70 = 0x736d6574695f;
  local_78 = 0x64613a3a74706d;
  local_71 = 100;
  pcVar6 = &convertable::operator_cast_to_group_(&to->super_convertable)->super_collection;
  local_a8.super_relation._vptr_relation = (_func_int **)0x0;
  iVar5 = (**(to->super_convertable)._vptr_convertable)(to,0x84);
  this._vptr_relation = (_func_int **)(collection **)0x0;
  if (-1 < iVar5) {
    this._vptr_relation = local_a8.super_relation._vptr_relation;
  }
  if ((head != (node *)0x0) &&
     (pcVar6 != (collection *)0x0 || (collection **)this._vptr_relation != (collection **)0x0)) {
    local_50 = (collection **)&PTR_find_001474a8;
    local_48 = relation;
    do {
      pcVar11 = &head->_meta->super_convertable;
      if ((pcVar11 == (convertable *)0x0 || pcVar6 == (collection *)0x0) ||
         (iVar5 = (*pcVar11->_vptr_convertable[2])(pcVar11), CONCAT44(extraout_var,iVar5) == 0)) {
        pcVar7 = (char *)mpt_node_ident(head);
        if (pcVar7 == (char *)0x0) {
          if (out == (logger *)0x0) {
            return false;
          }
          logger::message(out,(char *)&local_78,3,"%s %p: %s","node",head,"bad element name");
          return false;
        }
        if ((collection **)this._vptr_relation == (collection **)0x0) {
LAB_00129ae8:
          if (pcVar6 != (collection *)0x0) {
            local_60 = pcVar7;
            pcVar8 = (char *)mpt_convert_key(&local_60,0,&local_80);
            if ((pcVar8 == pcVar7) && (*pcVar8 != '\0')) {
              iVar5 = (*((collection *)&pcVar6->_vptr_collection)->_vptr_collection[3])
                                (pcVar6,pcVar8,(ulong)local_80);
              pcVar11 = (convertable *)CONCAT44(extraout_var_00,iVar5);
              if (pcVar11 == (convertable *)0x0) {
                if (out != (logger *)0x0) {
                  local_a8.super_relation._vptr_relation = (_func_int **)&local_a8._curr;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_a8,pcVar8,pcVar8 + CONCAT44(uStack_7c,local_80));
                  logger::message(out,(char *)&local_78,4,"%s: %s","invalid item type",
                                  local_a8.super_relation._vptr_relation);
                  if ((collection **)local_a8.super_relation._vptr_relation != &local_a8._curr) {
                    operator_delete(local_a8.super_relation._vptr_relation,
                                    (ulong)((long)&((collection *)
                                                   &(local_a8._curr)->_vptr_collection)->
                                                   _vptr_collection + 1));
                  }
                }
              }
              else {
                pcVar7 = (char *)mpt_convert_key(&local_60,":",&local_80);
                if ((pcVar7 == (char *)0x0) || (CONCAT44(uStack_7c,local_80) == 0)) {
                  if (out != (logger *)0x0) {
                    logger::message(out,(char *)&local_78,4,"%s","empty item name");
                  }
                  pp_Var10 = pcVar11->_vptr_convertable;
                }
                else {
                  local_a8.super_relation._vptr_relation = (_func_int **)local_50;
                  local_a8._parent = (relation *)0x0;
                  local_a8._sep = '.';
                  local_a8._curr = pcVar6;
                  local_88 = pcVar11;
                  iVar5 = (**pcVar11->_vptr_convertable)(pcVar11,0,0);
                  pcVar9 = collection::relation::find(&local_a8,(long)iVar5,pcVar7,local_80);
                  prVar2 = local_48;
                  pcVar11 = local_88;
                  local_68 = pcVar7;
                  if (pcVar9 == (convertable *)0x0) {
                    local_58 = CONCAT44(uStack_7c,local_80);
                    pcVar7 = (char *)mpt_convert_key(&local_60,0,&local_80);
                    rVar1._vptr_relation = local_a8.super_relation._vptr_relation;
                    local_a8.super_relation._vptr_relation = (_func_int **)local_50;
                    while (local_50 = (collection **)local_a8.super_relation._vptr_relation,
                          pcVar7 != (char *)0x0) {
                      if (prVar2 == (relation *)0x0) {
                        local_a8._parent = (relation *)0x0;
                        local_a8._sep = '.';
                        local_a8._curr = pcVar6;
                        iVar5 = (**local_88->_vptr_convertable)(local_88,0,0);
                        pcVar11 = collection::relation::find(&local_a8,(long)iVar5,pcVar7,local_80);
                      }
                      else {
                        local_a8.super_relation._vptr_relation = rVar1._vptr_relation;
                        iVar5 = (**local_88->_vptr_convertable)(local_88,0,0);
                        iVar5 = (**prVar2->_vptr_relation)
                                          (prVar2,(long)iVar5,pcVar7,(ulong)local_80);
                        pcVar11 = (convertable *)CONCAT44(extraout_var_01,iVar5);
                      }
                      pcVar9 = local_88;
                      if (pcVar11 == (convertable *)0x0) {
                        if (out != (logger *)0x0) {
                          pcVar8 = identifier::name(&head->ident);
                          local_a8.super_relation._vptr_relation = (_func_int **)&local_a8._curr;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_a8,pcVar7,
                                     pcVar7 + CONCAT44(uStack_7c,local_80));
                          logger::message(out,(char *)&local_78,3,"%s: \'%s\': %s",
                                          "unable to get parent",pcVar8,
                                          local_a8.super_relation._vptr_relation);
                          if ((collection **)local_a8.super_relation._vptr_relation !=
                              &local_a8._curr) {
                            operator_delete(local_a8.super_relation._vptr_relation,
                                            (ulong)((long)&((collection *)
                                                           &(local_a8._curr)->_vptr_collection)->
                                                           _vptr_collection + 1));
                          }
                        }
                        (*pcVar9->_vptr_convertable[1])(pcVar9);
                        return false;
                      }
                      local_a8.super_relation._vptr_relation = (_func_int **)0x0;
                      iVar5 = (**pcVar11->_vptr_convertable)(pcVar11,0x84,&local_a8);
                      rVar1._vptr_relation = local_a8.super_relation._vptr_relation;
                      if ((iVar5 < 0) ||
                         ((collection **)local_a8.super_relation._vptr_relation ==
                          (collection **)0x0)) {
LAB_0012a0c1:
                        (*local_88->_vptr_convertable[1])();
                        if (out == (logger *)0x0) {
                          return false;
                        }
                        pcVar8 = identifier::name(&head->ident);
                        local_a8.super_relation._vptr_relation = (_func_int **)&local_a8._curr;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_a8,pcVar7,pcVar7 + CONCAT44(uStack_7c,local_80))
                        ;
                        logger::message(out,(char *)&local_78,3,"%s: \'%s\': %s",
                                        "unable to get inheritance",pcVar8,
                                        local_a8.super_relation._vptr_relation);
                        if ((collection **)local_a8.super_relation._vptr_relation == &local_a8._curr
                           ) {
                          return false;
                        }
                        operator_delete(local_a8.super_relation._vptr_relation,
                                        (ulong)((long)&((collection *)
                                                       &(local_a8._curr)->_vptr_collection)->
                                                       _vptr_collection + 1));
                        return false;
                      }
                      local_a8.super_relation._vptr_relation = (_func_int **)0x0;
                      iVar5 = (**local_88->_vptr_convertable)(local_88,0x84,&local_a8);
                      if ((iVar5 < 0) ||
                         ((collection **)local_a8.super_relation._vptr_relation ==
                          (collection **)0x0)) goto LAB_0012a0c1;
                      object::set((object *)local_a8.super_relation._vptr_relation,
                                  (object *)rVar1._vptr_relation,out);
                      pcVar7 = (char *)mpt_convert_key(&local_60,0,&local_80);
                      rVar1._vptr_relation = local_a8.super_relation._vptr_relation;
                      local_a8.super_relation._vptr_relation = (_func_int **)local_50;
                      prVar2 = local_48;
                    }
                    local_a8.super_relation._vptr_relation = rVar1._vptr_relation;
                    identifier::identifier(&local_40,0x10);
                    bVar3 = identifier::set_name(&local_40,local_68,(int)local_58);
                    if (bVar3) {
                      iVar5 = (*((collection *)&pcVar6->_vptr_collection)->_vptr_collection[2])
                                        (pcVar6,&local_40,local_88);
                      if (iVar5 < 0) {
                        (*local_88->_vptr_convertable[1])();
                        bVar4 = 0;
                        if (out != (logger *)0x0) {
                          local_a8.super_relation._vptr_relation = (_func_int **)&local_a8._curr;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_a8,local_68,local_68 + (int)local_58);
                          logger::message(out,(char *)&local_78,3,"%s: %s","unable add item",
                                          local_a8.super_relation._vptr_relation);
                          goto LAB_0012a01d;
                        }
                      }
                      else if (head->children == (node *)0x0) {
                        bVar4 = 0;
                      }
                      else {
                        local_a8.super_relation._vptr_relation = (_func_int **)0x0;
                        iVar5 = (**local_88->_vptr_convertable)(local_88,0x84,&local_a8);
                        if ((out != (logger *)0x0) &&
                           (iVar5 < 0 ||
                            (collection **)local_a8.super_relation._vptr_relation ==
                            (collection **)0x0)) {
                          logger::message(out,(char *)&local_78,4,"%s (%p): %s",0,local_88,
                                          "element not an object");
                        }
                        if ((prVar2 == (relation *)0x0) ||
                           (pcVar12 = &convertable::operator_cast_to_group_(local_88)->
                                       super_collection, pcVar12 == (collection *)0x0)) {
                          bVar3 = add_items((metatype *)local_88,head->children,(relation *)0x0,out)
                          ;
                          bVar4 = bVar3 * '\x03' + 1;
                        }
                        else {
                          local_a8.super_relation._vptr_relation = (_func_int **)local_50;
                          local_a8._sep = '.';
                          local_a8._parent = prVar2;
                          local_a8._curr = pcVar12;
                          bVar3 = add_items((metatype *)local_88,head->children,
                                            &local_a8.super_relation,out);
                          bVar4 = !bVar3;
                        }
                      }
                    }
                    else {
                      bVar4 = 0;
                      if (out != (logger *)0x0) {
                        local_a8.super_relation._vptr_relation = (_func_int **)&local_a8._curr;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_a8,local_68,local_68 + (int)local_58);
                        logger::message(out,(char *)&local_78,3,"%s: %s","unable add item",
                                        local_a8.super_relation._vptr_relation);
LAB_0012a01d:
                        bVar4 = 0;
                        if ((collection **)local_a8.super_relation._vptr_relation != &local_a8._curr
                           ) {
                          operator_delete(local_a8.super_relation._vptr_relation,
                                          (ulong)((long)&((collection *)
                                                         &(local_a8._curr)->_vptr_collection)->
                                                         _vptr_collection + 1));
                        }
                      }
                    }
                    identifier::set_name(&local_40,(char *)0x0,0);
                    if ((bVar4 & 3) != 0) {
                      return false;
                    }
                    goto LAB_00129d1c;
                  }
                  if (out != (logger *)0x0) {
                    local_a8.super_relation._vptr_relation = (_func_int **)&local_a8._curr;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_a8,pcVar7,pcVar7 + CONCAT44(uStack_7c,local_80));
                    logger::message(out,(char *)&local_78,4,"%s: %s","conflicting item name",
                                    local_a8.super_relation._vptr_relation);
                    if ((collection **)local_a8.super_relation._vptr_relation != &local_a8._curr) {
                      operator_delete(local_a8.super_relation._vptr_relation,
                                      (ulong)((long)&((collection *)
                                                     &(local_a8._curr)->_vptr_collection)->
                                                     _vptr_collection + 1));
                    }
                  }
                  pp_Var10 = pcVar11->_vptr_convertable;
                }
                (*pp_Var10[1])(pcVar11);
              }
            }
            else if (out != (logger *)0x0) {
              logger::message(out,(char *)&local_78,4,"%s: %s","bad element name",pcVar7);
            }
          }
        }
        else if ((pcVar6 != (collection *)0x0) ||
                (iVar5 = (*(code *)((collection *)*this._vptr_relation)[1]._vptr_collection)
                                   (this._vptr_relation,pcVar7,pcVar11), iVar5 < 0)) {
          if (pcVar11 == (convertable *)0x0) goto LAB_00129ae8;
          local_a8.super_relation._vptr_relation = (_func_int **)0x0;
          local_a8._parent = (relation *)0x0;
          iVar5 = (**pcVar11->_vptr_convertable)(pcVar11,0x19,&local_a8);
          if ((iVar5 < 0) ||
             (bVar3 = object::set((object *)this._vptr_relation,pcVar7,(value *)&local_a8,out),
             !bVar3)) {
            pcVar8 = convertable::string(pcVar11);
            object::set((object *)this._vptr_relation,pcVar7,pcVar8,out);
          }
        }
      }
      else {
        iVar5 = (*((collection *)&pcVar6->_vptr_collection)->_vptr_collection[2])
                          (pcVar6,&head->ident,pcVar11);
        if (-1 < iVar5) {
          if (out != (logger *)0x0) {
            logger::message(out,(char *)&local_78,4,"%s %p: %s","group",pcVar6,
                            "failed to add object");
          }
          (*pcVar11->_vptr_convertable[1])(pcVar11);
        }
      }
LAB_00129d1c:
      head = head->next;
    } while (head != (node *)0x0);
  }
  return true;
}

Assistant:

bool add_items(metatype &to, const node *head, const relation *relation, logger *out)
{
	const char _func[] = "mpt::add_items";
	group *grp = to;
	object *obj = to;
	
	// no assignable target
	if (!grp && !obj) {
		return true;
	}
	
	for (; head; head = head->next) {
		metatype *from = head->_meta;
		
		if (grp && from && from->addref()) {
			reference<metatype> m;
			m.set_instance(from);
			if (grp->append(&head->ident, from) < 0) {
				m.detach();
			}
			else if (out) {
				out->message(_func, out->Warning, "%s %p: %s",
				             MPT_tr("group"), grp, MPT_tr("failed to add object"));
			}
			continue;
		}
		// name is property
		const char *name;
		
		if (!(name = mpt_node_ident(head))) {
			if (out) {
				out->message(_func, out->Error, "%s %p: %s",
				             MPT_tr("node"), head, MPT_tr("bad element name"));
			}
			return false;
		}
		// set property
		if (obj) {
			if (!grp) {
				if (obj->set_property(name, from) >= 0) {
					continue;
				}
			}
			if (from) {
				value val;
				
				if (from->get(val)) {
					if (obj->set(name, val, out)) {
						continue;
					}
				}
				obj->set(name, from->string(), out);
				continue;
			}
		}
		if (!grp) {
			continue;
		}
		// get item type
		const char *start, *pos;
		size_t len;
		start = pos = name;
		name = mpt_convert_key(&pos, 0, &len);
		if (!name || name != start || !*name) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("bad element name"), start);
			}
			continue;
		}
		// create item
		if (!(from = grp->create(name, len))) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("invalid item type"), std::string(name, len).c_str());
			}
			continue;
		}
		// get item name
		name = mpt_convert_key(&pos, ":", &len);
		
		if (!name || !len) {
			if (out) {
				out->message(_func, out->Warning, "%s",
				             MPT_tr("empty item name"));
			}
			from->unref();
			continue;
		}
		// name conflict on same level
		if (collection::relation(*grp).find(from->type(), name, len)) {
			if (out) {
				out->message(_func, out->Warning, "%s: %s",
				             MPT_tr("conflicting item name"), std::string(name, len).c_str());
			}
			from->unref();
			continue;
		}
		const char *ident = name;
		int ilen = len;
		
		// find dependant items
		while ((name = mpt_convert_key(&pos, 0, &len))) {
			convertable *curr;
			if (relation) {
				curr = relation->find(from->type(), name, len);
			} else {
				curr = collection::relation(*grp).find(from->type(), name, len);
			}
			if (!curr) {
				if (out) {
					out->message(_func, out->Error, "%s: '%s': %s",
					             MPT_tr("unable to get parent"), head->ident.name(), std::string(name, len).c_str());
				}
				from->unref();
				return false;
			}
			object *obj, *src;
			if ((src = *curr) && (obj = *from)) {
				obj->set(*src, out);
				continue;
			}
			from->unref();
			if (out) {
				out->message(_func, out->Error, "%s: '%s': %s",
				             MPT_tr("unable to get inheritance"), head->ident.name(), std::string(name, len).c_str());
			}
			return false;
		}
		// add item to group
		identifier id;
		if (!id.set_name(ident, ilen)) {
			if (out) {
				out->message(_func, out->Error, "%s: %s",
				             MPT_tr("unable add item"), std::string(ident, ilen).c_str());
			}
			continue;
		}
		if (grp->append(&id, from) < 0) {
			from->unref();
			if (out) {
				out->message(_func, out->Error, "%s: %s",
				             MPT_tr("unable add item"), std::string(ident, ilen).c_str());
			}
			continue;
		}
		// set properties and subitems
		if (!head->children) {
			continue;
		}
		// process child items
		object *curr;
		if (!(curr = *from)) {
			if (out) {
				out->message(_func, out->Warning, "%s (%p): %s",
				             name, from, MPT_tr("element not an object"));
			}
		}
		group *ig;
		if (!relation || !(ig = *from)) {
			if (!(add_items(*from, head->children, 0, out))) {
				return false;
			}
			continue;
		}
		collection::relation rel(*ig, relation);
		if (!(add_items(*from, head->children, &rel, out))) {
			return false;
		}
	}
	return true;
}